

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucurr.cpp
# Opt level: O0

char * ucurr_nextCurrencyList(UEnumeration *enumerator,int32_t *resultLength,UErrorCode *param_3)

{
  uint uVar1;
  uint *puVar2;
  CurrencyList *currItem;
  UCurrencyContext *myContext;
  UErrorCode *param_2_local;
  int32_t *resultLength_local;
  UEnumeration *enumerator_local;
  
  puVar2 = (uint *)enumerator->context;
  do {
    if (0x12e < puVar2[1]) {
      if (resultLength != (int32_t *)0x0) {
        *resultLength = 0;
      }
      return (char *)0x0;
    }
    uVar1 = puVar2[1];
    puVar2[1] = uVar1 + 1;
  } while ((*puVar2 != 0x7fffffff) && ((gCurrencyList[uVar1].currType & *puVar2) != *puVar2));
  if (resultLength != (int32_t *)0x0) {
    *resultLength = 3;
  }
  return gCurrencyList[uVar1].currency;
}

Assistant:

static const char* U_CALLCONV
ucurr_nextCurrencyList(UEnumeration *enumerator,
                        int32_t* resultLength,
                        UErrorCode * /*pErrorCode*/)
{
    UCurrencyContext *myContext = (UCurrencyContext *)(enumerator->context);

    /* Find the next in the list that matches the type we are looking for. */
    while (myContext->listIdx < UPRV_LENGTHOF(gCurrencyList)-1) {
        const struct CurrencyList *currItem = &gCurrencyList[myContext->listIdx++];
        if (UCURR_MATCHES_BITMASK(currItem->currType, myContext->currType))
        {
            if (resultLength) {
                *resultLength = 3; /* Currency codes are only 3 chars long */
            }
            return currItem->currency;
        }
    }
    /* We enumerated too far. */
    if (resultLength) {
        *resultLength = 0;
    }
    return NULL;
}